

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O2

void __thiscall
leveldb::Iterator::RegisterCleanup(Iterator *this,CleanupFunction func,void *arg1,void *arg2)

{
  CleanupNode *pCVar1;
  
  if (func != (CleanupFunction)0x0) {
    if ((this->cleanup_head_).function == (CleanupFunction)0x0) {
      pCVar1 = &this->cleanup_head_;
    }
    else {
      pCVar1 = (CleanupNode *)operator_new(0x20);
      pCVar1->function = (CleanupFunction)0x0;
      pCVar1->arg1 = (void *)0x0;
      pCVar1->arg2 = (void *)0x0;
      pCVar1->next = (CleanupNode *)0x0;
      pCVar1->next = (this->cleanup_head_).next;
      (this->cleanup_head_).next = pCVar1;
    }
    pCVar1->function = func;
    pCVar1->arg1 = arg1;
    pCVar1->arg2 = arg2;
    return;
  }
  __assert_fail("func != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator.cc"
                ,0x1b,"void leveldb::Iterator::RegisterCleanup(CleanupFunction, void *, void *)");
}

Assistant:

void Iterator::RegisterCleanup(CleanupFunction func, void* arg1, void* arg2) {
  assert(func != nullptr);
  CleanupNode* node;
  if (cleanup_head_.IsEmpty()) {
    node = &cleanup_head_;
  } else {
    node = new CleanupNode();
    node->next = cleanup_head_.next;
    cleanup_head_.next = node;
  }
  node->function = func;
  node->arg1 = arg1;
  node->arg2 = arg2;
}